

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_map.h
# Opt level: O1

uint64_t __thiscall
bloaty::RangeMap::RangeEndUnknownLimit(RangeMap *this,const_iterator iter,uint64_t unknown)

{
  undefined1 *puVar1;
  
  if (iter._M_node[2]._M_parent == (_Base_ptr)0xffffffffffffffff) {
    puVar1 = (undefined1 *)std::_Rb_tree_increment(iter._M_node);
    if ((&(this->mappings_)._M_t._M_impl.super__Rb_tree_header != (_Rb_tree_header *)puVar1) &&
       (*(ulong *)(puVar1 + 0x20) < unknown)) {
      unknown = *(ulong *)(puVar1 + 0x20);
    }
  }
  else {
    unknown = (long)&(iter._M_node[2]._M_parent)->_M_color + *(ulong *)(iter._M_node + 1);
    if (unknown <= *(ulong *)(iter._M_node + 1)) {
      __assert_fail("ret > iter->first",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/range_map.h"
                    ,0xda,
                    "uint64_t bloaty::RangeMap::RangeEndUnknownLimit(Map::const_iterator, uint64_t) const"
                   );
    }
  }
  return unknown;
}

Assistant:

uint64_t RangeEndUnknownLimit(Map::const_iterator iter,
                                uint64_t unknown) const {
    if (iter->second.size == kUnknownSize) {
      Map::const_iterator next = std::next(iter);
      if (IterIsEnd(next) || next->first > unknown) {
        return unknown;
      } else {
        return next->first;
      }
    } else {
      uint64_t ret = iter->first + iter->second.size;
      assert(ret > iter->first);
      return ret;
    }
  }